

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

PrimitiveTestClass * __thiscall
PrimitiveTestClass::operator=(PrimitiveTestClass *this,PrimitiveTestClass *other)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  code *pcVar14;
  char *pcVar15;
  uchar *puVar16;
  ulong uVar17;
  short *psVar18;
  unsigned_short *puVar19;
  int *piVar20;
  uint *puVar21;
  long *plVar22;
  unsigned_long *puVar23;
  longlong *plVar24;
  unsigned_long_long *puVar25;
  float *pfVar26;
  double *pdVar27;
  longdouble *plVar28;
  ulong uVar29;
  ulong *puVar30;
  TestArrObj *pTVar31;
  ulong uVar32;
  TestArrObj *local_40;
  ulong local_20;
  size_t i;
  PrimitiveTestClass *other_local;
  PrimitiveTestClass *this_local;
  
  this->c = other->c;
  this->uc = other->uc;
  this->s = other->s;
  this->us = other->us;
  this->i = other->i;
  this->ui = other->ui;
  this->l = other->l;
  this->ul = other->ul;
  this->ll = other->ll;
  this->ull = other->ull;
  this->f = other->f;
  this->d = other->d;
  this->ld = other->ld;
  pcVar15 = (char *)operator_new__(0xd);
  this->str = pcVar15;
  pcVar15 = this->str;
  pcVar1 = other->str;
  *(undefined8 *)pcVar15 = *(undefined8 *)pcVar1;
  *(undefined4 *)(pcVar15 + 8) = *(undefined4 *)(pcVar1 + 8);
  pcVar15[0xc] = pcVar1[0xc];
  pcVar15 = (char *)operator_new__((long)this->SIZE);
  this->pc = pcVar15;
  memcpy(this->pc,other->pc,(long)this->SIZE);
  puVar16 = (uchar *)operator_new__((long)this->SIZE);
  this->puc = puVar16;
  memcpy(this->puc,other->puc,(long)this->SIZE);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar2 * ZEXT816(2),0);
  if (SUB168(auVar2 * ZEXT816(2),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  psVar18 = (short *)operator_new__(uVar17);
  this->ps = psVar18;
  memcpy(this->ps,other->ps,(long)this->SIZE << 1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar3 * ZEXT816(2),0);
  if (SUB168(auVar3 * ZEXT816(2),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar19 = (unsigned_short *)operator_new__(uVar17);
  this->pus = puVar19;
  memcpy(this->pus,other->pus,(long)this->SIZE << 1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  piVar20 = (int *)operator_new__(uVar17);
  this->pi = piVar20;
  memcpy(this->pi,other->pi,(long)this->SIZE << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar21 = (uint *)operator_new__(uVar17);
  this->pui = puVar21;
  memcpy(this->pui,other->pui,(long)this->SIZE << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  plVar22 = (long *)operator_new__(uVar17);
  this->pl = plVar22;
  memcpy(this->pl,other->pl,(long)this->SIZE << 3);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar7 * ZEXT816(8),0);
  if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar23 = (unsigned_long *)operator_new__(uVar17);
  this->pul = puVar23;
  memcpy(this->pul,other->pul,(long)this->SIZE << 3);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar8 * ZEXT816(8),0);
  if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  plVar24 = (longlong *)operator_new__(uVar17);
  this->pll = plVar24;
  memcpy(this->pll,other->pll,(long)this->SIZE << 3);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar9 * ZEXT816(8),0);
  if (SUB168(auVar9 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar25 = (unsigned_long_long *)operator_new__(uVar17);
  this->pull = puVar25;
  memcpy(this->pull,other->pull,(long)this->SIZE << 3);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar10 * ZEXT816(4),0);
  if (SUB168(auVar10 * ZEXT816(4),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pfVar26 = (float *)operator_new__(uVar17);
  this->pf = pfVar26;
  memcpy(this->pf,other->pf,(long)this->SIZE << 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar11 * ZEXT816(8),0);
  if (SUB168(auVar11 * ZEXT816(8),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pdVar27 = (double *)operator_new__(uVar17);
  this->pd = pdVar27;
  memcpy(this->pd,other->pd,(long)this->SIZE << 3);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (long)this->SIZE;
  uVar17 = SUB168(auVar12 * ZEXT816(0x10),0);
  if (SUB168(auVar12 * ZEXT816(0x10),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  plVar28 = (longdouble *)operator_new__(uVar17);
  this->pld = plVar28;
  memcpy(this->pld,other->pld,(long)this->SIZE << 4);
  uVar17 = (ulong)this->SIZE;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar17;
  uVar29 = SUB168(auVar13 * ZEXT816(0x20),0);
  uVar32 = uVar29 + 8;
  if (SUB168(auVar13 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar29) {
    uVar32 = 0xffffffffffffffff;
  }
  puVar30 = (ulong *)operator_new__(uVar32);
  *puVar30 = uVar17;
  pTVar31 = (TestArrObj *)(puVar30 + 1);
  if (uVar17 != 0) {
    local_40 = pTVar31;
    do {
      TestArrObj::TestArrObj(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != pTVar31 + uVar17);
  }
  this->pto = pTVar31;
  for (local_20 = 0; local_20 < (ulong)(long)this->SIZE; local_20 = local_20 + 1) {
    TestArrObj::operator=(this->pto + local_20,other->pto + local_20);
  }
  std::shared_ptr<int>::operator=(&this->spi,&other->spi);
  std::shared_ptr<TestArrObj>::operator=(&this->spto,&other->spto);
  pcVar14 = (code *)invalidInstructionException();
  (*pcVar14)();
}

Assistant:

PrimitiveTestClass &operator=(const PrimitiveTestClass &other)
        {
            c = other.c;
            uc = other.uc;
            s = other.s;
            us = other.us;
            i = other.i;
            ui = other.ui;
            l = other.l;
            ul = other.ul;
            ll = other.ll;
            ull = other.ull;
            f = other.f;
            d = other.d;
            ld = other.ld;

            str = new char[strlen("Hello World!") + 1];
            memcpy(str, other.str, strlen("Hello World!") + 1);

            pc = new char[SIZE];
            memcpy(pc, other.pc, SIZE);
            puc = new unsigned char[SIZE];
            memcpy(puc, other.puc, SIZE);
            ps = new short[SIZE];
            memcpy(ps, other.ps, SIZE * sizeof(short));
            pus = new unsigned short[SIZE];
            memcpy(pus, other.pus, SIZE * sizeof(unsigned short));
            pi = new int[SIZE];
            memcpy(pi, other.pi, SIZE * sizeof(int));
            pui = new unsigned int[SIZE];
            memcpy(pui, other.pui, SIZE * sizeof(unsigned int));
            pl = new long[SIZE];
            memcpy(pl, other.pl, SIZE * sizeof(long));
            pul = new unsigned long[SIZE];
            memcpy(pul, other.pul, SIZE * sizeof(unsigned long));
            pll = new long long[SIZE];
            memcpy(pll, other.pll, SIZE * sizeof(long long));
            pull = new unsigned long long[SIZE];
            memcpy(pull, other.pull, SIZE * sizeof(unsigned long long));
            pf = new float[SIZE];
            memcpy(pf, other.pf, SIZE * sizeof(float));
            pd = new double[SIZE];
            memcpy(pd, other.pd, SIZE * sizeof(double));
            pld = new long double[SIZE];
            memcpy(pld, other.pld, SIZE * sizeof(long double));

            pto = new TestArrObj[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                pto[i] = other.pto[i];
            }

            spi = other.spi;
            spto = other.spto;
        }